

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void TestParseObjectDelete(void)

{
  FILE *pFVar1;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> pBVar2;
  ValueTypes VVar3;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> *ppBVar4;
  __tuple_element_t<0UL,_tuple<ParseResults,_BubbleValue_*>_> *p_Var5;
  BubbleValue *pBVar6;
  size_t sVar7;
  char *bubbleValue;
  double dVar8;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  BubbleJson local_30;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> local_20;
  BubbleValue *value;
  tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> result;
  
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::tuple<true,_true>
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  bubbleJson::BubbleJson::Parse(&local_30,(char *)&gm_BubbleJson);
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value,(type)&local_30);
  ppBVar4 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  local_20 = *ppBVar4;
  g_TestCount = g_TestCount + 1;
  p_Var5 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  pFVar1 = _stderr;
  if (*p_Var5 == ParseResult_Ok) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var5 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x215,0,(ulong)*p_Var5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  VVar3 = bubbleJson::BubbleValue::GetType(local_20);
  pFVar1 = _stderr;
  if (VVar3 == ValueType_Object) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    VVar3 = bubbleJson::BubbleValue::GetType(local_20);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x216,6,(ulong)VVar3);
    g_Result = 1;
  }
  pBVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"test",&local_51);
  bubbleJson::BubbleValue::DeleteObjectElementWithKey(pBVar2,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pBVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"test3",&local_89);
  bubbleJson::BubbleValue::DeleteObjectElementWithKey(pBVar2,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  g_TestCount = g_TestCount + 1;
  bubbleValue = "test2";
  pBVar6 = bubbleJson::BubbleValue::operator[](local_20,"test2");
  dVar8 = bubbleJson::BubbleValue::GetNumber(pBVar6);
  pFVar1 = _stderr;
  if ((dVar8 != 123.0) || (NAN(dVar8))) {
    pBVar6 = bubbleJson::BubbleValue::operator[](local_20,"test2");
    dVar8 = bubbleJson::BubbleValue::GetNumber(pBVar6);
    bubbleValue = "%s:%d: expect: %.17g actual: %.17g\n";
    fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",0x405ec00000000000,SUB84(dVar8,0),
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x21c);
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  sVar7 = bubbleJson::BubbleValue::GetObjectCount(local_20);
  pFVar1 = _stderr;
  if (sVar7 == 1) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    sVar7 = bubbleJson::BubbleValue::GetObjectCount(local_20);
    bubbleValue = "%s:%d: expect: %zu actual: %zu\n";
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x21d,1,sVar7);
    g_Result = 1;
  }
  pBVar2 = local_20;
  if (local_20 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(local_20);
    bubbleJson::BubbleValue::operator_delete(pBVar2,bubbleValue);
  }
  return;
}

Assistant:

static void TestParseObjectDelete()
{
    tuple<ParseResults, BubbleValue*> result;
    BubbleValue *value;

    result = gm_BubbleJson.Parse(" { \"test\": \"string\" , \"test2\": 123 } ");
    value = get<1>(result);
    EXPECT_EQ_INT(ParseResult_Ok, get<0>(result));
    EXPECT_EQ_INT(ValueType_Object, value->GetType());

    value->DeleteObjectElementWithKey("test");
    value->DeleteObjectElementWithKey("test3");//not exist

    //expect { "test2": 123 }
    EXPECT_EQ_DOUBLE(123.0, (*value)["test2"].GetNumber());
    EXPECT_EQ_SIZE_T(1, value->GetObjectCount());
    delete value;
}